

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_cdef_mse_calc_frame_mt(AV1_COMP *cpi)

{
  uint num_workers;
  pthread_mutex_t *__mutex;
  AVxWorker *pAVar1;
  EncWorkerData *pEVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  num_workers = (cpi->mt_info).num_mod_workers[6];
  __mutex = (cpi->mt_info).cdef_sync.mutex_;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  }
  *(undefined8 *)((long)&(cpi->mt_info).cdef_sync.fbr + 1) = 0;
  (cpi->mt_info).cdef_sync.end_of_frame = 0;
  (cpi->mt_info).cdef_sync.fbr = 0;
  lVar4 = (ulong)num_workers * 0x38 + -0x10;
  lVar3 = (ulong)num_workers * 0x1d0;
  for (uVar5 = num_workers; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
    pAVar1 = (cpi->mt_info).workers;
    pEVar2 = (cpi->mt_info).tile_thr_data;
    *(AV1_COMP **)(pEVar2[-1].error_info.detail + lVar3 + -0x20) = cpi;
    *(code **)((long)pAVar1 + lVar4 + -0x10) = cdef_filter_block_worker_hook;
    *(char **)((long)pAVar1 + lVar4 + -8) = pEVar2[-1].error_info.detail + lVar3 + -0x20;
    *(AV1CdefSync **)((long)&pAVar1->impl_ + lVar4) = &(cpi->mt_info).cdef_sync;
    lVar4 = lVar4 + -0x38;
    lVar3 = lVar3 + -0x1d0;
  }
  launch_workers(&cpi->mt_info,num_workers);
  sync_enc_workers(&cpi->mt_info,&cpi->common,num_workers);
  return;
}

Assistant:

void av1_cdef_mse_calc_frame_mt(AV1_COMP *cpi) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  AV1CdefSync *cdef_sync = &mt_info->cdef_sync;
  const int num_workers = mt_info->num_mod_workers[MOD_CDEF_SEARCH];

  cdef_reset_job_info(cdef_sync);
  prepare_cdef_workers(cpi, cdef_filter_block_worker_hook, num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, &cpi->common, num_workers);
}